

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void CClient::ConchainWindowBordered
               (IResult *pResult,void *pUserData,FCommandCallback pfnCallback,
               void *pCallbackUserData)

{
  int iVar1;
  int iVar2;
  IEngineGraphics *pIVar3;
  CConfig *pCVar4;
  undefined8 in_RCX;
  code *in_RDX;
  CClient *in_RSI;
  IResult *in_RDI;
  CClient *pSelf;
  
  pIVar3 = Graphics(in_RSI);
  if ((pIVar3 == (IEngineGraphics *)0x0) ||
     (iVar1 = IConsole::IResult::NumArguments(in_RDI), iVar1 == 0)) {
    (*in_RDX)(in_RDI,in_RCX);
  }
  else {
    pCVar4 = Config(in_RSI);
    if (pCVar4->m_GfxFullscreen == 0) {
      pCVar4 = Config(in_RSI);
      iVar1 = pCVar4->m_GfxBorderless;
      iVar2 = (*in_RDI->_vptr_IResult[2])(in_RDI,0);
      if (iVar1 != iVar2) {
        (*(in_RSI->super_IClient).super_IInterface._vptr_IInterface[0xf])();
      }
    }
  }
  return;
}

Assistant:

void CClient::ConchainWindowBordered(IConsole::IResult *pResult, void *pUserData, IConsole::FCommandCallback pfnCallback, void *pCallbackUserData)
{
	CClient *pSelf = (CClient *)pUserData;
	if(pSelf->Graphics() && pResult->NumArguments())
	{
		if(!pSelf->Config()->m_GfxFullscreen && (pSelf->Config()->m_GfxBorderless != pResult->GetInteger(0)))
			pSelf->ToggleWindowBordered();
	}
	else
		pfnCallback(pResult, pCallbackUserData);
}